

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_utf8.c
# Opt level: O3

int u8_utf8toucs2(uint16_t *dest,int sz,char *src,int srcsz)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  ulong uVar4;
  short sVar5;
  byte *pbVar7;
  ushort uVar8;
  ushort uVar9;
  short sVar6;
  
  uVar3 = 0;
  if (1 < sz) {
    pbVar7 = (byte *)(src + srcsz);
    uVar4 = 0;
    do {
      bVar1 = *src;
      uVar9 = (ushort)bVar1;
      bVar2 = ""[bVar1];
      if (srcsz == -1) {
        if (bVar1 == 0) goto LAB_00178254;
      }
      else if (pbVar7 <= (byte *)src + (char)bVar2) goto LAB_00178254;
      sVar6 = 0;
      sVar5 = 0;
      switch(bVar2) {
      case 0:
        uVar8 = (ushort)bVar2;
        break;
      case 3:
        sVar6 = (ushort)bVar1 << 6;
        uVar9 = (ushort)((byte *)src)[1];
        src = (char *)((byte *)src + 1);
      case 2:
        sVar6 = (uVar9 + sVar6) * 0x40;
        uVar9 = (ushort)((byte *)src)[1];
        src = (char *)((byte *)src + 1);
      case 1:
        uVar8 = (uVar9 + sVar6) * 0x40;
        uVar9 = (ushort)((byte *)src)[1];
        src = (char *)((byte *)src + 1);
        break;
      default:
        goto switchD_001781f7_default;
      }
      src = (char *)((byte *)src + 1);
      sVar5 = uVar9 + uVar8;
switchD_001781f7_default:
      dest[uVar4] = sVar5 - (short)offsetsFromUTF8[(char)bVar2];
      uVar4 = uVar4 + 1;
    } while (sz - 1U != uVar4);
    uVar4 = (ulong)(sz - 1U);
LAB_00178254:
    uVar3 = (uint)uVar4;
  }
  dest[uVar3] = 0;
  return uVar3;
}

Assistant:

int u8_utf8toucs2(uint16_t *dest, int sz, const char *src, int srcsz)
{
    uint16_t ch;
    const char *src_end = src + srcsz;
    int nb;
    int i=0;

    while (i < sz-1) {
        nb = trailingBytesForUTF8[(unsigned char)*src];
        if (srcsz == -1) {
            if (*src == 0)
                goto done_toucs;
        }
        else {
            if (src + nb >= src_end)
                goto done_toucs;
        }
        ch = 0;
        switch (nb) {
        case 3: ch += (unsigned char)*src++; ch <<= 6; /* falls through */
        case 2: ch += (unsigned char)*src++; ch <<= 6; /* falls through */
        case 1: ch += (unsigned char)*src++; ch <<= 6; /* falls through */
        case 0: ch += (unsigned char)*src++; /* falls through */
        }
        ch -= offsetsFromUTF8[nb];
        dest[i++] = ch;
    }
 done_toucs:
    dest[i] = 0;
    return i;
}